

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

void Gia_ManCorrRemapSimInfo(Gia_Man_t *p,Vec_Ptr_t *vInfo)

{
  int iVar1;
  void **ppvVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  
  if (1 < vInfo->nSize) {
    iVar11 = p->nRegs;
    if (0 < iVar11) {
      ppvVar2 = vInfo->pArray;
      pVVar3 = p->vCis;
      uVar8 = (uint)((ulong)((long)ppvVar2[1] - (long)*ppvVar2) >> 2);
      lVar10 = 0;
      do {
        iVar1 = pVVar3->nSize;
        iVar9 = iVar1 - iVar11;
        uVar6 = (int)lVar10 + iVar9;
        if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = pVVar3->pArray[uVar6];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0064a8b1:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return;
        }
        uVar13 = (ulong)(uint)p->pReprs[iVar1] & 0xfffffff;
        if (uVar13 != 0xfffffff) {
          if ((uint)p->nObjs <= (uint)uVar13) goto LAB_0064a8b1;
          if (((uint)p->pReprs[iVar1] >> 0x1d & 1) == 0) {
            if (vInfo->nSize <= lVar10) goto LAB_0064a8ef;
            pvVar4 = ppvVar2[lVar10];
            if (0 < (int)uVar8) {
              uVar7 = 0;
              do {
                if (*(int *)((long)pvVar4 + uVar7 * 4) != 0) {
                  __assert_fail("pInfoObj[w] == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                                ,0x151,"void Gia_ManCorrRemapSimInfo(Gia_Man_t *, Vec_Ptr_t *)");
                }
                uVar7 = uVar7 + 1;
              } while ((uVar8 & 0x7fffffff) != uVar7);
            }
            uVar13 = *(ulong *)(p->pObjs + uVar13);
            if ((~uVar13 & 0x1fffffff1fffffff) != 0) {
              if ((~(uint)uVar13 & 0x9fffffff) != 0) {
LAB_0064a90e:
                __assert_fail("Gia_ObjIsRo(p, pRepr)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                              ,0x155,"void Gia_ManCorrRemapSimInfo(Gia_Man_t *, Vec_Ptr_t *)");
              }
              uVar6 = (uint)(uVar13 >> 0x20) & 0x1fffffff;
              uVar12 = uVar6 - iVar9;
              if ((int)uVar6 < iVar9) goto LAB_0064a90e;
              if (((int)uVar12 < 0) || (vInfo->nSize <= (int)uVar12)) goto LAB_0064a8ef;
              if (0 < (int)uVar8) {
                pvVar5 = ppvVar2[uVar12];
                uVar13 = 0;
                do {
                  *(undefined4 *)((long)pvVar4 + uVar13 * 4) =
                       *(undefined4 *)((long)pvVar5 + uVar13 * 4);
                  uVar13 = uVar13 + 1;
                } while ((uVar8 & 0x7fffffff) != uVar13);
                iVar11 = p->nRegs;
              }
            }
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar11);
    }
    return;
  }
LAB_0064a8ef:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Gia_ManCorrRemapSimInfo( Gia_Man_t * p, Vec_Ptr_t * vInfo )
{
    Gia_Obj_t * pObj, * pRepr;
    unsigned * pInfoObj, * pInfoRepr;
    int i, w, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    Gia_ManForEachRo( p, pObj, i )
    {
        // skip ROs without representatives
        pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
        if ( pRepr == NULL || Gia_ObjFailed(p, Gia_ObjId(p,pObj)) )
            continue;
        pInfoObj = (unsigned *)Vec_PtrEntry( vInfo, i );
        for ( w = 0; w < nWords; w++ )
            assert( pInfoObj[w] == 0 );
        // skip ROs with constant representatives
        if ( Gia_ObjIsConst0(pRepr) )
            continue;
        assert( Gia_ObjIsRo(p, pRepr) );
//        Abc_Print( 1, "%d -> %d    ", i, Gia_ObjId(p, pRepr) );
        // transfer info from the representative
        pInfoRepr = (unsigned *)Vec_PtrEntry( vInfo, Gia_ObjCioId(pRepr) - Gia_ManPiNum(p) );
        for ( w = 0; w < nWords; w++ )
            pInfoObj[w] = pInfoRepr[w];
    }
//    Abc_Print( 1, "\n" );
}